

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

int __thiscall String::printf(String *this,char *__format,...)

{
  code *pcVar1;
  char in_AL;
  int iVar2;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list ap;
  int result;
  char *format_local;
  String *this_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  detach(this,0,200);
  ap[0].overflow_arg_area = local_f8;
  ap[0]._0_8_ = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 0x10;
  this_local._4_4_ = vsnprintf(this->data->str,this->data->capacity,__format,&local_48);
  if ((this_local._4_4_ < 0) || (this->data->capacity <= (ulong)(long)this_local._4_4_)) {
    ap[0].overflow_arg_area = local_f8;
    ap[0]._0_8_ = &stack0x00000008;
    local_44 = 0x30;
    local_48 = 0x10;
    iVar2 = vsnprintf((char *)0x0,0,__format,&local_48);
    if (iVar2 < 0) {
      iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/String.cpp"
                            ,0x2c,"result >= 0");
      if (iVar3 != 0) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    if (iVar2 < 0) {
      this_local._4_4_ = -1;
    }
    else {
      detach(this,0,(long)iVar2);
      ap[0].overflow_arg_area = local_f8;
      ap[0]._0_8_ = &stack0x00000008;
      local_44 = 0x30;
      local_48 = 0x10;
      this_local._4_4_ = vsnprintf(this->data->str,(long)(iVar2 + 1),__format,&local_48);
      if (this_local._4_4_ < 0) {
        iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/String.cpp"
                              ,0x33,"result >= 0");
        if (iVar2 != 0) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
      this->data->len = (long)this_local._4_4_;
    }
  }
  else {
    this->data->len = (long)this_local._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int String::printf(const char* format, ...)
{
  detach(0, 200);

  int result;
  va_list ap;
  va_start(ap, format);

  {
    result = vsnprintf((char*)data->str, data->capacity, format, ap);
    va_end(ap);
    if(result >= 0 && (usize)result < data->capacity)
    {
      data->len = result;
      return result;
    }
  }

  // buffer was too small: compute size, reserve buffer, print again
  {
    va_start(ap, format);
#ifdef _MSC_VER
    result = _vscprintf(format, ap);
#else
    result = vsnprintf(0, 0, format, ap);
#endif
    va_end(ap);
    ASSERT(result >= 0);
    if(result < 0)
      return -1;
    detach(0, result);
    va_start(ap, format);
    result = vsnprintf((char*)data->str, result + 1, format, ap);
    va_end(ap);
    ASSERT(result >= 0);
    data->len = result;
    va_end(ap);
    return result;
  }
}